

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O2

int __thiscall Settings::processArguments(Settings *this,int argc,char **argv)

{
  int iVar1;
  
  iVar1 = processArgs(this,argc,argv);
  return iVar1;
}

Assistant:

int Settings::processArguments(int argc, char *argv[])
{
    int retval = 0;
    try
    {
        retval = processArgs(argc, argv);
    }
    catch (std::exception &e) // command-line argument errors
    {
        std::cout << "ERROR : " << e.what() << std::endl;
        displayHelp();
        retval = 1;
    }
    return retval;
}